

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

void arm946_initfn(uc_struct_conflict1 *uc,CPUState *obj)

{
  obj[1].tb_jmp_cache[0x5f3] = (TranslationBlock *)((ulong)obj[1].tb_jmp_cache[0x5f3] | 0x108080);
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x646) = 0x41059461;
  *(undefined8 *)((long)obj[1].tb_jmp_cache + 0x323c) = 0x780f004006;
  return;
}

Assistant:

static void arm946_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);

    set_feature(&cpu->env, ARM_FEATURE_V5);
    set_feature(&cpu->env, ARM_FEATURE_PMSA);
    set_feature(&cpu->env, ARM_FEATURE_DUMMY_C15_REGS);
    cpu->midr = 0x41059461;
    cpu->ctr = 0x0f004006;
    cpu->reset_sctlr = 0x00000078;
}